

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

idx_t duckdb::DictionaryCompression::RequiredSpace
                (idx_t current_count,idx_t index_count,idx_t dict_size,
                bitpacking_width_t packing_width)

{
  unsigned_long uVar1;
  
  if ((current_count & 0x1f) != 0) {
    uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)current_count & 0x1f);
    current_count = (current_count - uVar1) + 0x20;
  }
  return dict_size + index_count * 4 + (packing_width * current_count >> 3) + 0x14;
}

Assistant:

idx_t DictionaryCompression::RequiredSpace(idx_t current_count, idx_t index_count, idx_t dict_size,
                                           bitpacking_width_t packing_width) {
	idx_t base_space = DICTIONARY_HEADER_SIZE + dict_size;
	idx_t string_number_space = BitpackingPrimitives::GetRequiredSize(current_count, packing_width);
	idx_t index_space = index_count * sizeof(uint32_t);

	idx_t used_space = base_space + index_space + string_number_space;

	return used_space;
}